

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

CVmGramProdState *
CVmObjGramProd::enqueue_new_state
          (CVmGramProdMem *mem,size_t start_tok_pos,CVmGramProdState *enclosing_state,
          vmgram_alt_info *altp,vm_obj_id_t self,int *need_to_clone,CVmGramProdQueue *queues,
          int circular_alt)

{
  CVmGramProdState *state_00;
  CVmGramProdMem *in_RCX;
  int in_ESI;
  undefined4 in_R8D;
  CVmGramProdState *in_R9;
  CVmGramProdQueue *in_stack_00000008;
  CVmGramProdState *state;
  undefined4 in_stack_ffffffffffffffbc;
  vm_obj_id_t in_stack_ffffffffffffffc4;
  vmgram_alt_info *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  state_00 = create_new_state(in_RCX,CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9,
                              in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                              (int *)CONCAT44(in_stack_ffffffffffffffbc,state._0_4_),in_ESI);
  if (*(int *)((long)&in_RCX->block_head_ + 4) == 0) {
    enqueue_state(state_00,in_stack_00000008);
  }
  else {
    state_00->nxt_ = in_stack_00000008->badness_queue_;
    in_stack_00000008->badness_queue_ = state_00;
  }
  return state_00;
}

Assistant:

CVmGramProdState *CVmObjGramProd::
   enqueue_new_state(CVmGramProdMem *mem,
                     size_t start_tok_pos,
                     CVmGramProdState *enclosing_state,
                     const vmgram_alt_info *altp, vm_obj_id_t self,
                     int *need_to_clone, CVmGramProdQueue *queues,
                     int circular_alt)
{
    CVmGramProdState *state;

    /* create the new state */
    state = create_new_state(mem, start_tok_pos, enclosing_state,
                             altp, self, need_to_clone, circular_alt);
    
    /* 
     *   Add the item to the appropriate queue.  If the item has an
     *   associated badness, add it to the badness queue.  Otherwise, add
     *   it to the work queue.  
     */
    if (altp->badness != 0)
    {
        /* 
         *   we have a badness rating - add it to the badness queue, since
         *   we don't want to process it until we entirely exhaust better
         *   possibilities 
         */
        state->nxt_ = queues->badness_queue_;
        queues->badness_queue_ = state;
    }
    else
    {
        /* enqueue the state */
        enqueue_state(state, queues);
    }

    /* return the new state */
    return state;
}